

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::H1V2Convert(jpeg_decoder *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  int j;
  long lVar7;
  int iVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  if (0 < this->m_max_mcus_per_row) {
    lVar4 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
    uVar11 = (uint)lVar4;
    lVar7 = (ulong)(uVar11 & 7) * 8 + 0x40;
    if ((int)uVar11 < 8) {
      lVar7 = lVar4 * 8;
    }
    puVar5 = this->m_pSample_buf + lVar7;
    puVar6 = this->m_pScan_line_1;
    puVar9 = this->m_pScan_line_0;
    puVar10 = this->m_pSample_buf + (long)(int)(uVar11 * 4 & 0xfffffff8) + 0x80;
    iVar3 = this->m_max_mcus_per_row;
    do {
      lVar4 = 0;
      lVar7 = 0;
      do {
        iVar13 = this->m_crr[puVar10[lVar7 + 0x40]];
        uVar11 = (uint)puVar5[lVar7];
        iVar12 = iVar13 + uVar11;
        iVar8 = 0;
        if (iVar12 < 1) {
          iVar12 = iVar8;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        iVar14 = this->m_cbg[puVar10[lVar7]] + this->m_crg[puVar10[lVar7 + 0x40]] >> 0x10;
        iVar15 = this->m_cbb[puVar10[lVar7]];
        puVar9[lVar7 * 4] = (uint8)iVar12;
        iVar12 = uVar11 + iVar14;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        puVar9[lVar7 * 4 + 1] = (uint8)iVar12;
        iVar12 = uVar11 + iVar15;
        if (iVar12 < 1) {
          iVar12 = iVar8;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        puVar9[lVar7 * 4 + 2] = (uint8)iVar12;
        puVar9[lVar7 * 4 + 3] = 0xff;
        bVar1 = puVar5[lVar7 + 8];
        iVar13 = iVar13 + (uint)bVar1;
        if (iVar13 < 1) {
          iVar13 = iVar8;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        puVar6[lVar7 * 4] = (uint8)iVar13;
        iVar14 = iVar14 + (uint)bVar1;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        puVar6[lVar7 * 4 + 1] = (uint8)iVar14;
        iVar15 = iVar15 + (uint)bVar1;
        if (0 < iVar15) {
          iVar8 = iVar15;
        }
        if (0xfe < iVar8) {
          iVar8 = 0xff;
        }
        puVar6[lVar7 * 4 + 2] = (uint8)iVar8;
        puVar6[lVar7 * 4 + 3] = 0xff;
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + -4;
      } while (lVar7 != 8);
      puVar5 = puVar5 + 0x100;
      puVar10 = puVar10 + 0x100;
      puVar9 = puVar9 + -lVar4;
      puVar6 = puVar6 + -lVar4;
      bVar2 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 1 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 2 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int j = 0; j < 8; j++)
			{
				int cb = c[0 + j];
				int cr = c[64 + j];

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				int yy = y[j];
				d0[0] = clamp(yy + rc);
				d0[1] = clamp(yy + gc);
				d0[2] = clamp(yy + bc);
				d0[3] = 255;

				yy = y[8 + j];
				d1[0] = clamp(yy + rc);
				d1[1] = clamp(yy + gc);
				d1[2] = clamp(yy + bc);
				d1[3] = 255;

				d0 += 4;
				d1 += 4;
			}

			y += 64 * 4;
			c += 64 * 4;
		}
	}